

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5AtomicCountersArrayIndexing.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GPUShader5AtomicCountersArrayIndexing::iterate(GPUShader5AtomicCountersArrayIndexing *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1b0;
  uint local_2c;
  uint *puStack_28;
  GLuint expectedResult;
  GLuint *bufferData;
  Functions *gl;
  GPUShader5AtomicCountersArrayIndexing *this_local;
  
  gl = (Functions *)this;
  initTest(this);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  bufferData = (GLuint *)CONCAT44(extraout_var,iVar1);
  (**(code **)(bufferData + 0x5a0))(this->m_program_id);
  dVar2 = (**(code **)(bufferData + 0x200))();
  glu::checkError(dVar2,"Could not use program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x84);
  (**(code **)(bufferData + 0x14a))(10,10,1);
  dVar2 = (**(code **)(bufferData + 0x200))();
  glu::checkError(dVar2,"Failed to dispatch compute operation!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x89);
  puStack_28 = (uint *)(**(code **)(bufferData + 0x340))(0x92c0,0,0x10,1);
  dVar2 = (**(code **)(bufferData + 0x200))();
  glu::checkError(dVar2,"Failed to map buffer range to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x8f);
  local_2c = 1000;
  if ((((*puStack_28 == 1000) && (puStack_28[1] == 0x3e9)) && (puStack_28[2] == 0x3ea)) &&
     (puStack_28[3] == 0x3eb)) {
    (**(code **)(bufferData + 0x59c))(0x92c0);
    dVar2 = (**(code **)(bufferData + 0x200))();
    glu::checkError(dVar2,"Failed to unmap buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                    ,0xa5);
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [37])"Invalid data rendered. Expected Data");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2afcbee);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])") Result Data");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2afcbee);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,puStack_28);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2c5c974);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,puStack_28 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2c5c974);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,puStack_28 + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2c5c974);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,puStack_28 + 3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    (**(code **)(bufferData + 0x59c))(0x92c0);
    dVar2 = (**(code **)(bufferData + 0x200))();
    glu::checkError(dVar2,"Failed to unmap buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                    ,0x9e);
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5AtomicCountersArrayIndexing::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do the computations */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program object!");

	gl.dispatchCompute(10, /* num_groups_x */
					   10, /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch compute operation!");

	/* Map the buffer object storage into user space */
	glw::GLuint* bufferData =
		(glw::GLuint*)gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, /* offset */
										m_atomic_counters_array_size * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to map buffer range to client space!");

	/* Compare the result values with reference value */
	const glw::GLuint expectedResult = 1000;

	if (expectedResult != bufferData[0] || expectedResult + 1 != bufferData[1] || expectedResult + 2 != bufferData[2] ||
		expectedResult + 3 != bufferData[3])
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data rendered. Expected Data"
						   << " (" << expectedResult << ", " << expectedResult << ", " << expectedResult << ", "
						   << expectedResult << ") Result Data"
						   << " (" << bufferData[0] << " ," << bufferData[1] << " ," << bufferData[2] << " ,"
						   << bufferData[3] << ")" << tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unmap buffer!");

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unmap buffer!");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}